

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderNextSibling(xmlTextReaderPtr reader)

{
  _xmlNode *p_Var1;
  int iVar2;
  xmlTextReaderState xVar3;
  
  iVar2 = -1;
  if (((reader == (xmlTextReaderPtr)0x0) || (reader->doc == (xmlDocPtr)0x0)) ||
     (iVar2 = 0, reader->state == XML_TEXTREADER_END)) {
    return iVar2;
  }
  if (reader->node != (xmlNodePtr)0x0) {
    p_Var1 = reader->node->next;
    if (p_Var1 == (_xmlNode *)0x0) {
      return 0;
    }
    reader->node = p_Var1;
    reader->state = XML_TEXTREADER_START;
    return 1;
  }
  if (reader->state == XML_TEXTREADER_END) {
    return 0;
  }
  if (reader->node == (xmlNodePtr)0x0) {
    p_Var1 = reader->doc->children;
    if (p_Var1 == (_xmlNode *)0x0) {
      iVar2 = 0;
      xVar3 = XML_TEXTREADER_END;
      goto LAB_0017559d;
    }
LAB_00175591:
    reader->node = p_Var1;
  }
  else {
    if (reader->state != XML_TEXTREADER_BACKTRACK) {
      p_Var1 = reader->node->next;
      if (p_Var1 != (_xmlNode *)0x0) goto LAB_00175591;
      reader->state = XML_TEXTREADER_BACKTRACK;
      xmlTextReaderRead(reader);
    }
    p_Var1 = reader->node->next;
    if (p_Var1 == (_xmlNode *)0x0) {
      p_Var1 = reader->node->parent;
      iVar2 = 1;
      xVar3 = XML_TEXTREADER_END;
      if (p_Var1 != (_xmlNode *)0x0) {
        if (p_Var1->type == XML_DOCUMENT_NODE) {
          iVar2 = 0;
        }
        else {
          reader->node = p_Var1;
          reader->depth = reader->depth + -1;
          reader->state = XML_TEXTREADER_BACKTRACK;
          xmlTextReaderNextTree(reader);
        }
      }
      goto LAB_0017559d;
    }
    reader->node = p_Var1;
  }
  iVar2 = 1;
  xVar3 = XML_TEXTREADER_START;
LAB_0017559d:
  reader->state = xVar3;
  return iVar2;
}

Assistant:

int
xmlTextReaderNextSibling(xmlTextReaderPtr reader) {
    if (reader == NULL)
        return(-1);
    if (reader->doc == NULL) {
        /* TODO */
	return(-1);
    }

    if (reader->state == XML_TEXTREADER_END)
        return(0);

    if (reader->node == NULL)
        return(xmlTextReaderNextTree(reader));

    if (reader->node->next != NULL) {
        reader->node = reader->node->next;
        reader->state = XML_TEXTREADER_START;
        return(1);
    }

    return(0);
}